

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sumStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  double *pdVar2;
  i64 iVar3;
  double dVar4;
  
  if ((short)context->pMem->flags < 0) {
    pdVar2 = (double *)context->pMem->z;
  }
  else {
    pdVar2 = (double *)createAggContext(context,0x20);
  }
  iVar1 = sqlite3_value_numeric_type(*argv);
  if (iVar1 == 5 || pdVar2 == (double *)0x0) {
    return;
  }
  pdVar2[2] = (double)((long)pdVar2[2] + 1);
  if (iVar1 != 1) {
    dVar4 = sqlite3VdbeRealValue(*argv);
    *pdVar2 = dVar4 + *pdVar2;
    *(undefined1 *)((long)pdVar2 + 0x19) = 1;
    return;
  }
  iVar3 = sqlite3VdbeIntValue(*argv);
  *pdVar2 = (double)iVar3 + *pdVar2;
  if (*(char *)(pdVar2 + 3) != '\0' || *(char *)((long)pdVar2 + 0x19) != '\0') {
    return;
  }
  dVar4 = pdVar2[1];
  if (iVar3 < 0) {
    if ((-1 < (long)dVar4) || (-0x7fffffffffffffff - (long)dVar4 <= iVar3 + 1)) goto LAB_001b7dcf;
  }
  else if ((long)dVar4 < 1 || iVar3 <= 0x7fffffffffffffff - (long)dVar4) {
LAB_001b7dcf:
    pdVar2[1] = (double)((long)dVar4 + iVar3);
    return;
  }
  *(undefined2 *)(pdVar2 + 3) = 0x101;
  return;
}

Assistant:

static void sumStep(sqlite3_context *context, int argc, sqlite3_value **argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  if( p && type!=SQLITE_NULL ){
    p->cnt++;
    if( type==SQLITE_INTEGER ){
      i64 v = sqlite3_value_int64(argv[0]);
      p->rSum += v;
      if( (p->approx|p->overflow)==0 && sqlite3AddInt64(&p->iSum, v) ){
        p->approx = p->overflow = 1;
      }
    }else{
      p->rSum += sqlite3_value_double(argv[0]);
      p->approx = 1;
    }
  }
}